

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O3

void make_ironbarwalls(level *lev,int chance)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  schar *psVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  
  if (0 < chance) {
    psVar8 = &lev->locations[2][1].typ;
    lVar9 = 1;
    do {
      lVar9 = lVar9 + 1;
      lVar7 = -0xe4;
      do {
        cVar1 = psVar8[lVar7 + -0x114];
        cVar2 = psVar8[lVar7 + -0x24];
        cVar3 = psVar8[lVar7 + 0xe4];
        cVar4 = psVar8[lVar7 + -0xc];
        if (psVar8[lVar7 + -0x18] == '\x01') {
          if (((cVar2 == '\x16') || (cVar2 != '\0' && cVar2 < '\r')) &&
             (bVar10 = cVar4 != '\0', bVar5 = cVar4 < '\r', bVar11 = cVar4 == '\x16', cVar4 = cVar3,
             cVar2 = cVar1, bVar11 || bVar5 && bVar10)) {
joined_r0x001db3e7:
            if ((('\x17' < cVar2) && ('\x17' < cVar4)) &&
               (uVar6 = mt_random(), (int)(uVar6 % 100) < chance)) {
              psVar8[lVar7 + -0x18] = '\x16';
            }
          }
        }
        else if (psVar8[lVar7 + -0x18] == '\x02') {
          if (((cVar1 == '\x16') || (cVar1 != '\0' && cVar1 < '\r')) &&
             (cVar3 == '\x16' || cVar3 < '\r' && cVar3 != '\0')) goto joined_r0x001db3e7;
        }
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0);
      psVar8 = psVar8 + 0xfc;
    } while (lVar9 != 0x4f);
  }
  return;
}

Assistant:

static void make_ironbarwalls(struct level *lev, int chance)
{
	xchar x, y;

	if (chance < 1) return;

	for (x = 1; x < COLNO - 1; x++) {
	    for(y = 1; y < ROWNO - 1; y++) {
		schar typ = lev->locations[x][y].typ;
		schar left = lev->locations[x - 1][y].typ;
		schar right = lev->locations[x + 1][y].typ;
		schar above = lev->locations[x][y - 1].typ;
		schar below = lev->locations[x][y + 1].typ;
		if (typ == HWALL) {
		    if ((IS_WALL(left)  || left  == IRONBARS) &&
			(IS_WALL(right) || right == IRONBARS) &&
			SPACE_POS(above) && SPACE_POS(below) &&
			rn2(100) < chance) {
			lev->locations[x][y].typ = IRONBARS;
		    }
		} else if (typ == VWALL) {
		    if ((IS_WALL(above) || above == IRONBARS) &&
			(IS_WALL(below) || below == IRONBARS) &&
			SPACE_POS(left) && SPACE_POS(right) &&
			rn2(100) < chance) {
			lev->locations[x][y].typ = IRONBARS;
		    }
		}
	    }
	}
}